

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IntegerTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntegerTypeSyntax,slang::syntax::IntegerTypeSyntax_const&>
          (BumpAllocator *this,IntegerTypeSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  IntegerTypeSyntax *pIVar13;
  
  pIVar13 = (IntegerTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IntegerTypeSyntax *)this->endPtr < pIVar13 + 1) {
    pIVar13 = (IntegerTypeSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pIVar13 + 1);
  }
  (pIVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  (pIVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
       (args->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
       = uVar5;
  (pIVar13->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  uVar6 = (args->keyword).field_0x2;
  NVar7.raw = (args->keyword).numFlags.raw;
  uVar8 = (args->keyword).rawLen;
  pIVar2 = (args->keyword).info;
  TVar9 = (args->signing).kind;
  uVar10 = (args->signing).field_0x2;
  NVar11.raw = (args->signing).numFlags.raw;
  uVar12 = (args->signing).rawLen;
  pIVar3 = (args->signing).info;
  (pIVar13->keyword).kind = (args->keyword).kind;
  (pIVar13->keyword).field_0x2 = uVar6;
  (pIVar13->keyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar13->keyword).rawLen = uVar8;
  (pIVar13->keyword).info = pIVar2;
  (pIVar13->signing).kind = TVar9;
  (pIVar13->signing).field_0x2 = uVar10;
  (pIVar13->signing).numFlags = (NumericTokenFlags)NVar11.raw;
  (pIVar13->signing).rawLen = uVar12;
  (pIVar13->signing).info = pIVar3;
  (pIVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->dimensions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pIVar13->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar13->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pIVar13->dimensions).super_SyntaxListBase.childCount =
       (args->dimensions).super_SyntaxListBase.childCount;
  sVar4 = (args->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar13->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_ptr = (args->dimensions).
            super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar13->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>
  ._M_extent._M_extent_value = sVar4;
  (pIVar13->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc680;
  return pIVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }